

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O0

void etdc_gencodes(etdc_table *table)

{
  int k;
  int i;
  int p;
  int num;
  int first;
  int paux;
  etdc_table *s;
  etdc_table *table_local;
  
  first = 0;
  num = 0x80;
  k = 1;
  p = 0;
  s = table;
  while (s != (etdc_table *)0x0) {
    paux = 0;
    for (; s != (etdc_table *)0x0 && paux < num; s = (etdc_table *)(s->hh).next) {
      s->code[k + -1] = (char)(paux % 0x80) + 0x80;
      for (i = k + -2; paux = paux / 0x80, -1 < i; i = i + -1) {
        s->code[i] = (uchar)(paux % 0x80);
      }
      s->size = k;
      p = p + 1;
      paux = p - first;
    }
    k = k + 1;
    first = first + num;
    num = num << 7;
  }
  return;
}

Assistant:

void etdc_gencodes(struct etdc_table *table) {
  struct etdc_table *s;
  int paux;
  int first;
  int num;
  int p;
  int i,k;
  first = 0;
  num = 128;
  k = 1;
  p = 0;
  for(s=table; s != NULL;) {
    paux = 0;

    for(; (s != (struct etdc_table*)NULL) && (paux < num); s=(struct etdc_table*)s->hh.next) {
      s->code[k - 1] = 128 + paux % 128;
      paux = paux / 128;

      for( i = k -2; i >= 0; i--) {
	s->code[i] = paux % 128;
	paux = paux / 128;
      }
      s->size = k;

      p++;
      paux = p - first;
    }
    k++;
    first = first + num;
    num = num*128;
  }

}